

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject(Group *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  undefined1 uVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  uint64_t ijt;
  AntiPGMController *this_00;
  _Rb_tree_node_base *p_Var7;
  P<r_exec::View> *this_01;
  CSTController *this_02;
  ostream *poVar8;
  MDLController *c;
  Group *pGVar9;
  Controller *pCVar10;
  InputLessPGMController *this_03;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  _Mem *p_Var13;
  TimeJob *pTVar14;
  uint64_t uVar15;
  Atom a;
  bool inject_in_secondary_group;
  pthread_mutex_t *local_38;
  
  local_38 = (pthread_mutex_t *)&this->mutex;
  std::mutex::lock((mutex *)&local_38->__data);
  p_Var2 = (view->super_View).object.object;
  iVar6 = (*p_Var2->_vptr__Object[4])(p_Var2,0);
  _a = *(undefined4 *)CONCAT44(extraout_var,iVar6);
  ijt = (*Now)();
  r_code::View::set_ijt(&view->super_View,ijt);
  uVar3 = r_code::Atom::getDescriptor();
  switch(uVar3) {
  case 0xc3:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    this_01 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->other_views,(key_type *)&inject_in_secondary_group);
    goto LAB_00182fe8;
  case 0xc4:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    this_01 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->other_views,(key_type *)&inject_in_secondary_group);
LAB_00182fe8:
    core::P<r_exec::View>::operator=(this_01,view);
    cov(this,view);
    break;
  case 0xc9:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    pCVar10 = (Controller *)operator_new(0xa0);
    PGMController::PGMController((PGMController *)pCVar10,&view->super_View);
    core::P<r_exec::Controller>::operator=(&view->controller,pCVar10);
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*(pCVar10->super__Object)._vptr__Object[5])(pCVar10);
      for (p_Var12 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var12 !=
          &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        Controller::_take_input(pCVar10,*(View **)(p_Var12 + 1));
      }
    }
    break;
  case 0xca:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    r_code::Utils::GetString<r_code::Code>
              ((string *)&inject_in_secondary_group,(Code *)(view->super_View).object.object,1);
    pCVar10 = CPPPrograms::New((string *)&inject_in_secondary_group,&view->super_View);
    if (pCVar10 == (Controller *)0x0) {
      std::__cxx11::string::~string((string *)&inject_in_secondary_group);
      goto LAB_001834a6;
    }
    core::P<r_exec::Controller>::operator=(&view->controller,pCVar10);
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*(pCVar10->super__Object)._vptr__Object[5])(pCVar10);
      for (p_Var12 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var12 !=
          &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        Controller::_take_input(pCVar10,*(View **)(p_Var12 + 1));
      }
    }
    std::__cxx11::string::~string((string *)&inject_in_secondary_group);
    break;
  case 0xcb:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->input_less_ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    this_03 = (InputLessPGMController *)operator_new(200);
    InputLessPGMController::InputLessPGMController(this_03,&view->super_View);
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_03);
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*(this_03->super__PGMController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])(this_03);
      p_Var13 = (_Mem *)r_code::Mem::Get();
      pTVar14 = (TimeJob *)operator_new(0x28);
      uVar15 = r_code::Utils::GetTimestamp<r_code::Code>((Code *)(view->super_View).object.object,4)
      ;
      InputLessPGMSignalingJob::InputLessPGMSignalingJob
                ((InputLessPGMSignalingJob *)pTVar14,view,uVar15 + ijt);
      _Mem::pushTimeJob(p_Var13,pTVar14);
    }
    break;
  case 0xcc:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->anti_ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    this_00 = (AntiPGMController *)operator_new(200);
    AntiPGMController::AntiPGMController(this_00,&view->super_View);
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_00);
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*(this_00->super__PGMController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])(this_00);
      for (p_Var7 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var7 !=
            &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        Controller::_take_input((Controller *)this_00,*(View **)(p_Var7 + 1));
      }
      p_Var13 = (_Mem *)r_code::Mem::Get();
      pTVar14 = (TimeJob *)operator_new(0x28);
      uVar15 = r_code::Utils::GetTimestamp<r_code::Code>
                         ((Code *)(((this_00->super__PGMController).super_OController.
                                    super_Controller.view)->object).object,4);
      AntiPGMSignalingJob::AntiPGMSignalingJob((AntiPGMSignalingJob *)pTVar14,view,uVar15 + ijt);
      _Mem::pushTimeJob(p_Var13,pTVar14);
    }
    break;
  case 0xcd:
    poVar8 = _Mem::Output(HLP_INJ);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&inject_in_secondary_group);
    poVar8 = std::operator<<(poVar8,(string *)&inject_in_secondary_group);
    poVar8 = std::operator<<(poVar8," cst ");
    (*((view->super_View).object.object)->_vptr__Object[2])();
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," injected");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&inject_in_secondary_group);
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    this_02 = (CSTController *)operator_new(0x1e8);
    CSTController::CSTController(this_02,&view->super_View);
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)this_02);
    pGVar9 = get_secondary_group(this);
    CSTController::set_secondary_host(this_02,pGVar9);
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*(this_02->super_HLPController).super_OController.super_Controller.super__Object.
        _vptr__Object[5])(this_02);
      for (p_Var12 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var12 !=
          &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        Controller::_take_input((Controller *)this_02,*(View **)(p_Var12 + 1));
      }
    }
    break;
  case 0xce:
    poVar8 = _Mem::Output(HLP_INJ);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&inject_in_secondary_group);
    poVar8 = std::operator<<(poVar8,(string *)&inject_in_secondary_group);
    poVar8 = std::operator<<(poVar8," mdl ");
    (*((view->super_View).object.object)->_vptr__Object[2])();
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," injected");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&inject_in_secondary_group);
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    c = MDLController::New(view,&inject_in_secondary_group);
    core::P<r_exec::Controller>::operator=(&view->controller,(Controller *)c);
    if (inject_in_secondary_group == true) {
      pGVar9 = get_secondary_group(this);
      inject_secondary_mdl_controller(pGVar9,view);
    }
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*(c->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object[5])
                (c);
      for (p_Var12 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var12 !=
          &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        Controller::_take_input((Controller *)c,*(View **)(p_Var12 + 1));
      }
    }
    break;
  case 0xcf:
    _inject_in_secondary_group = (pointer)View::get_oid(view);
    pmVar11 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ipgm_views,(key_type *)&inject_in_secondary_group);
    core::P<r_exec::View>::operator=(pmVar11,view);
    bVar5 = is_active_pgm(this,view);
    if (bVar5) {
      (*((view->controller).object)->_vptr__Object[5])();
      cVar4 = r_code::Atom::takesPastInputs();
      if (cVar4 != '\0') {
        for (p_Var12 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var12 !=
            &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
          Controller::_take_input((Controller *)(view->controller).object,*(View **)(p_Var12 + 1));
        }
      }
    }
  }
  bVar5 = is_eligible_input(this,view);
  if (bVar5) {
    LOCK();
    paVar1 = &(view->super_View).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    _inject_in_secondary_group = (pointer)view;
    std::
    _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
    ::_M_insert_equal<core::P<r_exec::View>>
              ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                *)&this->newly_salient_views,(P<r_exec::View> *)&inject_in_secondary_group);
    core::P<r_exec::View>::~P((P<r_exec::View> *)&inject_in_secondary_group);
    inject_reduction_jobs(this,view);
  }
LAB_001834a6:
  r_code::Atom::~Atom(&a);
  pthread_mutex_unlock(local_38);
  return;
}

Assistant:

void Group::inject(View *view)
{
    std::lock_guard<std::mutex> guard(mutex);
    Atom a = view->object->code(0);
    uint64_t now = Now();
    view->set_ijt(now);

    switch (a.getDescriptor()) {
    case Atom::NULL_PROGRAM: // the view comes with a controller.
        ipgm_views[view->get_oid()] = view;

        if (is_active_pgm(view)) {
            view->controller->gain_activation();

            if (a.takesPastInputs()) {
                std::multiset<P<View>, r_code::View::Less>::const_iterator v;

                for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                    view->controller->_take_input(*v);    // view will be copied.
                }
            }
        }

        break;

    case Atom::INSTANTIATED_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        PGMController *c = new PGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::INSTANTIATED_CPP_PROGRAM: {
        ipgm_views[view->get_oid()] = view;
        std::string str = Utils::GetString<Code>(view->object, ICPP_PGM_NAME);
        Controller *c = CPPPrograms::New(str, view);

        if (!c) {
            return;
        }

        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::INSTANTIATED_ANTI_PROGRAM: {
        anti_ipgm_views[view->get_oid()] = view;
        AntiPGMController *c = new AntiPGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }

            _Mem::Get()->pushTimeJob(new AntiPGMSignalingJob(view, now + Utils::GetTimestamp<Code>(c->getObject(), IPGM_TSC)));
        }

        break;
    }

    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: {
        input_less_ipgm_views[view->get_oid()] = view;
        InputLessPGMController *c = new InputLessPGMController(view);
        view->controller = c;

        if (is_active_pgm(view)) {
            c->gain_activation();
            _Mem::Get()->pushTimeJob(new InputLessPGMSignalingJob(view, now + Utils::GetTimestamp<Code>(view->object, IPGM_TSC)));
        }

        break;
    }

    case Atom::MARKER: // the marker has already been added to the mks of its references.
        other_views[view->get_oid()] = view;
        cov(view);
        break;

    case Atom::OBJECT:
        other_views[view->get_oid()] = view;
        cov(view);
        break;

    case Atom::COMPOSITE_STATE: {
        OUTPUT(HLP_INJ) << Utils::RelativeTime(Now()) << " cst " << view->object->get_oid() << " injected" << std::endl;
        ipgm_views[view->get_oid()] = view;
        CSTController *c = new CSTController(view);
        view->controller = c;
        c->set_secondary_host(get_secondary_group());

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->_take_input(*v);    // view will be copied.
            }
        }

        break;
    }

    case Atom::MODEL: {
        OUTPUT(HLP_INJ) << Utils::RelativeTime(Now()) << " mdl " << view->object->get_oid() << " injected" << std::endl;
        ipgm_views[view->get_oid()] = view;
        bool inject_in_secondary_group;
        MDLController *c = MDLController::New(view, inject_in_secondary_group);
        view->controller = c;

        if (inject_in_secondary_group) {
            get_secondary_group()->inject_secondary_mdl_controller(view);
        }

        if (is_active_pgm(view)) {
            c->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                c->Controller::_take_input(*v);    // view will be copied.
            }
        }

        break;
    }
    }

    if (is_eligible_input(view)) { // have existing programs reduce the new view.
        newly_salient_views.insert(view);
        inject_reduction_jobs(view);
    }

    //if(get_oid()==2)
    // std::cout<<Utils::RelativeTime(Now())<<" stdin <- "<<view->object->get_oid()<<std::endl;
}